

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

Option * __thiscall
CLI::App::add_flag_function
          (App *this,string *flag_name,function<void_(long)> *function,string *flag_description)

{
  Option *pOVar1;
  _Any_data local_c8;
  _Manager_type local_b8;
  _Invoker_type local_b0;
  callback_t fun;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  function<void_(long)> local_40;
  
  std::function<void_(long)>::function(&local_40,function);
  ::std::
  function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>::
  function<CLI::App::add_flag_function(std::__cxx11::string,std::function<void(long)>,std::__cxx11::string)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)_1_,void>
            ((function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>
              *)&fun,(anon_class_32_1_3a3b9956 *)&local_40);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_40);
  ::std::__cxx11::string::string
            ((string *)&local_80,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)flag_name);
  local_c8._M_unused._M_object = (void *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = (_Manager_type)0x0;
  local_b0 = fun._M_invoker;
  if (fun.super__Function_base._M_manager != (_Manager_type)0x0) {
    local_c8._M_unused._M_object = fun.super__Function_base._M_functor._M_unused._M_object;
    local_c8._8_8_ = fun.super__Function_base._M_functor._8_8_;
    local_b8 = fun.super__Function_base._M_manager;
    fun.super__Function_base._M_manager = (_Manager_type)0x0;
    fun._M_invoker = (_Invoker_type)0x0;
  }
  ::std::__cxx11::string::string
            (&local_60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)flag_description);
  pOVar1 = _add_flag_internal(this,&local_80,(callback_t *)&local_c8,(string *)&local_60);
  pOVar1 = Option::multi_option_policy(pOVar1,Sum);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_c8);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::_Function_base::~_Function_base((_Function_base *)&fun);
  return pOVar1;
}

Assistant:

CLI11_INLINE Option *
App::add_flag_function(std::string flag_name,
                       std::function<void(std::int64_t)> function,  ///< A function to call, void(int)
                       std::string flag_description) {

    CLI::callback_t fun = [function](const CLI::results_t &res) {
        using CLI::detail::lexical_cast;
        std::int64_t flag_count{0};
        lexical_cast(res[0], flag_count);
        function(flag_count);
        return true;
    };
    return _add_flag_internal(flag_name, std::move(fun), std::move(flag_description))
        ->multi_option_policy(MultiOptionPolicy::Sum);
}